

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TFunction * __thiscall
glslang::TParseContext::findFunction120
          (TParseContext *this,TSourceLoc *loc,TFunction *call,bool *builtIn)

{
  TSymbolTable *pTVar1;
  TFunction *pTVar2;
  TType *pTVar3;
  TIntermediate *pTVar4;
  TFunction *pTVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  TBasicType TVar12;
  TBasicType TVar13;
  undefined4 extraout_var;
  TSymbol *pTVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TFunction *pTVar15;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long lVar16;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  uint uVar17;
  pointer ppTVar18;
  ulong uVar19;
  TVector<const_glslang::TFunction_*> candidateList;
  TVector<const_glslang::TFunction_*> local_58;
  
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[6])(call);
  pTVar14 = TSymbolTable::find(pTVar1,(TString *)CONCAT44(extraout_var,iVar10),builtIn,(bool *)0x0,
                               (int *)0x0);
  if (pTVar14 != (TSymbol *)0x0) {
    iVar10 = (*pTVar14->_vptr_TSymbol[7])(pTVar14);
    return (TFunction *)CONCAT44(extraout_var_00,iVar10);
  }
  local_58.
  super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  local_58.
  super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
  local_58.
  super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[6])(call);
  TSymbolTable::findFunctionNameList
            (pTVar1,(TString *)CONCAT44(extraout_var_01,iVar10),&local_58,builtIn);
  if (local_58.
      super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      .
      super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_58.
      super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      .
      super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pTVar15 = (TFunction *)0x0;
  }
  else {
    pTVar15 = (TFunction *)0x0;
    ppTVar18 = local_58.
               super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
               .
               super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      pTVar2 = *ppTVar18;
      iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[0x24])(call);
      iVar11 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x24])(pTVar2);
      pTVar5 = pTVar15;
      if (iVar10 == iVar11) {
        iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x24])(pTVar2);
        if (0 < iVar10) {
          uVar19 = 0;
          bVar9 = true;
          do {
            iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,uVar19);
            pTVar3 = *(TType **)(CONCAT44(extraout_var_02,iVar10) + 8);
            iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,uVar19);
            bVar6 = TType::operator==(pTVar3,*(TType **)(CONCAT44(extraout_var_03,iVar10) + 8));
            bVar8 = bVar9;
            if (!bVar6) {
              iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,uVar19);
              cVar7 = (**(code **)(**(long **)(CONCAT44(extraout_var_04,iVar10) + 8) + 0xe8))();
              if (cVar7 == '\0') {
                iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,uVar19);
                cVar7 = (**(code **)(**(long **)(CONCAT44(extraout_var_05,iVar10) + 8) + 0xe8))();
                if (cVar7 != '\0') goto LAB_00433e3f;
                iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,uVar19);
                pTVar3 = *(TType **)(CONCAT44(extraout_var_06,iVar10) + 8);
                iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,uVar19);
                bVar6 = TType::sameElementShape
                                  (pTVar3,*(TType **)(CONCAT44(extraout_var_07,iVar10) + 8),
                                   (int *)0x0,(int *)0x0);
                bVar8 = false;
                if (bVar6) {
                  iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,uVar19);
                  lVar16 = (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar10) + 8) + 0x50))()
                  ;
                  bVar6 = bVar9;
                  if (((*(uint *)(lVar16 + 8) & 0x7f) < 0x14) &&
                     ((0xd0000U >> (*(uint *)(lVar16 + 8) & 0x1f) & 1) != 0)) {
                    pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                    iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,uVar19);
                    TVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_09,iVar10) + 8) + 0x38))
                                       ();
                    iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,uVar19);
                    TVar13 = (**(code **)(**(long **)(CONCAT44(extraout_var_10,iVar10) + 8) + 0x38))
                                       ();
                    bVar8 = TIntermediate::canImplicitlyPromote(pTVar4,TVar12,TVar13,EOpNull);
                    bVar6 = false;
                    if (bVar8) {
                      bVar6 = bVar9;
                    }
                  }
                  iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,uVar19);
                  lVar16 = (**(code **)(**(long **)(CONCAT44(extraout_var_11,iVar10) + 8) + 0x50))()
                  ;
                  bVar8 = bVar6;
                  if ((*(uint *)(lVar16 + 8) & 0x7f) - 0x11 < 2) {
                    pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                    iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,uVar19);
                    TVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_12,iVar10) + 8) + 0x38))
                                       ();
                    iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,uVar19);
                    TVar13 = (**(code **)(**(long **)(CONCAT44(extraout_var_13,iVar10) + 8) + 0x38))
                                       ();
                    bVar9 = TIntermediate::canImplicitlyPromote(pTVar4,TVar12,TVar13,EOpNull);
                    bVar8 = false;
                    if (bVar9) {
                      bVar8 = bVar6;
                    }
                  }
                }
              }
              else {
LAB_00433e3f:
                bVar8 = false;
              }
              if (!bVar8) break;
            }
            uVar17 = (int)uVar19 + 1;
            uVar19 = (ulong)uVar17;
            iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x24])(pTVar2);
            bVar9 = bVar8;
          } while ((int)uVar17 < iVar10);
          if (!bVar8) goto LAB_00434024;
        }
        pTVar5 = pTVar2;
        if (pTVar15 != (TFunction *)0x0) {
          iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,
                     "ambiguous function signature match: multiple signatures match under implicit type conversion"
                     ,*(undefined8 *)(CONCAT44(extraout_var_14,iVar10) + 8),"");
          pTVar5 = pTVar15;
        }
      }
LAB_00434024:
      pTVar15 = pTVar5;
      ppTVar18 = ppTVar18 + 1;
    } while (ppTVar18 !=
             local_58.
             super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
             .
             super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (pTVar15 == (TFunction *)0x0) {
    iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"no matching overloaded function found",
               *(undefined8 *)(CONCAT44(extraout_var_15,iVar10) + 8),"");
  }
  return pTVar15;
}

Assistant:

const TFunction* TParseContext::findFunction120(const TSourceLoc& loc, const TFunction& call, bool& builtIn)
{
    // first, look for an exact match
    TSymbol* symbol = symbolTable.find(call.getMangledName(), &builtIn);
    if (symbol)
        return symbol->getAsFunction();

    // exact match not found, look through a list of overloaded functions of the same name

    // "If no exact match is found, then [implicit conversions] will be applied to find a match. Mismatched types
    // on input parameters (in or inout or default) must have a conversion from the calling argument type to the
    // formal parameter type. Mismatched types on output parameters (out or inout) must have a conversion
    // from the formal parameter type to the calling argument type.  When argument conversions are used to find
    // a match, it is a semantic error if there are multiple ways to apply these conversions to make the call match
    // more than one function."

    const TFunction* candidate = nullptr;
    TVector<const TFunction*> candidateList;
    symbolTable.findFunctionNameList(call.getMangledName(), candidateList, builtIn);

    for (auto it = candidateList.begin(); it != candidateList.end(); ++it) {
        const TFunction& function = *(*it);

        // to even be a potential match, number of arguments has to match
        if (call.getParamCount() != function.getParamCount())
            continue;

        bool possibleMatch = true;
        for (int i = 0; i < function.getParamCount(); ++i) {
            // same types is easy
            if (*function[i].type == *call[i].type)
                continue;

            // We have a mismatch in type, see if it is implicitly convertible

            if (function[i].type->isArray() || call[i].type->isArray() ||
                ! function[i].type->sameElementShape(*call[i].type))
                possibleMatch = false;
            else {
                // do direction-specific checks for conversion of basic type
                if (function[i].type->getQualifier().isParamInput()) {
                    if (! intermediate.canImplicitlyPromote(call[i].type->getBasicType(), function[i].type->getBasicType()))
                        possibleMatch = false;
                }
                if (function[i].type->getQualifier().isParamOutput()) {
                    if (! intermediate.canImplicitlyPromote(function[i].type->getBasicType(), call[i].type->getBasicType()))
                        possibleMatch = false;
                }
            }
            if (! possibleMatch)
                break;
        }
        if (possibleMatch) {
            if (candidate) {
                // our second match, meaning ambiguity
                error(loc, "ambiguous function signature match: multiple signatures match under implicit type conversion", call.getName().c_str(), "");
            } else
                candidate = &function;
        }
    }

    if (candidate == nullptr)
        error(loc, "no matching overloaded function found", call.getName().c_str(), "");

    return candidate;
}